

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuHeapD.c
# Opt level: O1

void Fxu_HeapDoubleMoveDn(Fxu_HeapDouble *p,Fxu_Double *pDiv)

{
  Fxu_Double **ppFVar1;
  int iVar2;
  int iVar3;
  Fxu_Double *pFVar4;
  uint uVar5;
  int iVar6;
  Fxu_Double **ppFVar7;
  Fxu_Double **ppFVar8;
  Fxu_Double *pFVar9;
  
  iVar2 = p->nItems;
  pFVar4 = p->pTree[pDiv->HNum];
  uVar5 = pFVar4->HNum * 2;
  if ((int)uVar5 <= iVar2) {
    ppFVar7 = p->pTree + pDiv->HNum;
    iVar6 = pFVar4->HNum;
    do {
      ppFVar8 = p->pTree + (int)uVar5;
      if ((int)uVar5 < iVar2) {
        ppFVar1 = p->pTree + (int)(uVar5 | 1);
        iVar3 = (*ppFVar8)->Weight;
        if ((iVar3 <= pFVar4->Weight) && ((*ppFVar1)->Weight <= pFVar4->Weight)) {
          return;
        }
        pFVar9 = *ppFVar8;
        if (iVar3 < (*ppFVar1)->Weight) {
          ppFVar8 = ppFVar1;
          pFVar9 = *ppFVar1;
        }
      }
      else {
        pFVar9 = *ppFVar8;
        if ((*ppFVar8)->Weight <= pFVar4->Weight) {
          return;
        }
      }
      *ppFVar7 = pFVar9;
      *ppFVar8 = pFVar4;
      iVar3 = (*ppFVar7)->HNum;
      (*ppFVar7)->HNum = iVar6;
      pFVar4->HNum = iVar3;
      uVar5 = iVar3 * 2;
      ppFVar7 = ppFVar8;
      iVar6 = iVar3;
    } while ((int)uVar5 <= iVar2);
  }
  return;
}

Assistant:

void Fxu_HeapDoubleMoveDn( Fxu_HeapDouble * p, Fxu_Double * pDiv )
{
    Fxu_Double ** ppChild1, ** ppChild2, ** ppDiv;
    ppDiv = &FXU_HEAP_DOUBLE_CURRENT(p, pDiv);
    while ( FXU_HEAP_DOUBLE_CHILD1_EXISTS(p,*ppDiv) )
    { // if Child1 does not exist, Child2 also does not exists

        // get the children
        ppChild1 = &FXU_HEAP_DOUBLE_CHILD1(p,*ppDiv);
        if ( FXU_HEAP_DOUBLE_CHILD2_EXISTS(p,*ppDiv) )
        {
            ppChild2 = &FXU_HEAP_DOUBLE_CHILD2(p,*ppDiv);

            // consider two cases
            if ( FXU_HEAP_DOUBLE_WEIGHT(*ppDiv) >= FXU_HEAP_DOUBLE_WEIGHT(*ppChild1) &&
                 FXU_HEAP_DOUBLE_WEIGHT(*ppDiv) >= FXU_HEAP_DOUBLE_WEIGHT(*ppChild2) )
            { // Div is larger than both, skip
                break;
            }
            else
            { // Div is smaller than one of them, then swap it with larger 
                if ( FXU_HEAP_DOUBLE_WEIGHT(*ppChild1) >= FXU_HEAP_DOUBLE_WEIGHT(*ppChild2) )
                {
                    Fxu_HeapDoubleSwap( ppDiv, ppChild1 );
                    // update the pointer
                    ppDiv = ppChild1;
                }
                else
                {
                    Fxu_HeapDoubleSwap( ppDiv, ppChild2 );
                    // update the pointer
                    ppDiv = ppChild2;
                }
            }
        }
        else // Child2 does not exist
        {
            // consider two cases
            if ( FXU_HEAP_DOUBLE_WEIGHT(*ppDiv) >= FXU_HEAP_DOUBLE_WEIGHT(*ppChild1) )
            { // Div is larger than Child1, skip
                break;
            }
            else
            { // Div is smaller than Child1, then swap them
                Fxu_HeapDoubleSwap( ppDiv, ppChild1 );
                // update the pointer
                ppDiv = ppChild1;
            }
        }
    }
}